

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O2

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  tm *ptVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uStack_60;
  char DaysInMonth [12];
  long local_48;
  tm tmbuf;
  
  builtin_strncpy(DaysInMonth + 8,"\x1e\x1f\x1e\x1f",4);
  uVar5 = Year + 0x76c;
  if (99 < (ulong)Year) {
    uVar5 = Year;
  }
  if (Year < 0x45) {
    uVar5 = Year + 2000;
  }
  DaysInMonth[1] = 0x1c;
  if (((uVar5 & 3) == 0) && (DaysInMonth[1] = 0x1d, (long)uVar5 % 100 == 0)) {
    DaysInMonth[1] = (long)uVar5 % 400 == 0 | 0x1c;
  }
  DaysInMonth[0] = '\x1f';
  builtin_strncpy(DaysInMonth + 2,"\x1f\x1e\x1f\x1e\x1f\x1f",6);
  local_48 = -1;
  if (((((0 < Day) && (0xfffffffffffffff3 < Month - 0xdU)) && (0xffffffffffffffbb < uVar5 - 0x7f6))
      && (((ulong)Seconds < 0x3c && ((ulong)Minutes < 0x3c)))) &&
     (((ulong)Hours < 0x18 && (Day <= DaysInMonth[Month + -1])))) {
    lVar4 = Day + -1;
    for (lVar2 = 0; Month + -1 != lVar2; lVar2 = lVar2 + 1) {
      lVar4 = lVar4 + DaysInMonth[lVar2];
    }
    for (uVar3 = 0x7b2; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      lVar4 = lVar4 + 0x16d + (ulong)((uVar3 & 3) == 0);
    }
    local_48 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + lVar4 * 0x15180;
    uStack_60 = 0x55d8bf;
    ptVar1 = localtime_r(&local_48,(tm *)&tmbuf);
    if ((DSTmode == DSTon) || ((DSTmode == DSTmaybe && (ptVar1->tm_isdst != 0)))) {
      local_48 = local_48 + -0xe10;
    }
  }
  return local_48;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	signed char DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t		Julian;
	int		i;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm	tmbuf;
#endif

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year >= 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Julian) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Julian, &tmbuf);
#else
	ltime = localtime(&Julian);
#endif
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && ltime->tm_isdst))
		Julian -= HOUR;
	return Julian;
}